

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::EqualityComparisonOp<true>::evaluate
          (EqualityComparisonOp<true> *this,ExecValueAccess dst,ExecConstValueAccess a,
          ExecConstValueAccess b)

{
  bool bVar1;
  bool bVar2;
  bool b_00;
  Type TVar3;
  int iVar4;
  int iVar5;
  VariableType *pVVar6;
  bool *pbVar7;
  float a_00;
  float b_01;
  ConstStridedValueAccess<64> local_c0;
  ConstStridedValueAccess<64> local_b0;
  int local_9c;
  bool local_95;
  int elemNdx_2;
  undefined1 auStack_90 [3];
  bool result_2;
  int compNdx_2;
  ConstStridedValueAccess<64> local_80;
  int local_6c;
  bool local_65;
  int elemNdx_1;
  undefined1 auStack_60 [3];
  bool result_1;
  int compNdx_1;
  ConstStridedValueAccess<64> local_50;
  int local_3c;
  bool local_35;
  int elemNdx;
  bool result;
  EqualityComparisonOp<true> *pEStack_30;
  int compNdx;
  EqualityComparisonOp<true> *this_local;
  ExecConstValueAccess a_local;
  ExecValueAccess dst_local;
  
  a_local.m_type = (VariableType *)a.m_value;
  this_local = (EqualityComparisonOp<true> *)a.m_type;
  a_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<64>.m_type;
  pEStack_30 = this;
  pVVar6 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&this_local);
  TVar3 = VariableType::getBaseType(pVVar6);
  if (TVar3 == TYPE_FLOAT) {
    for (elemNdx = 0; elemNdx < 0x40; elemNdx = elemNdx + 1) {
      local_35 = true;
      local_3c = 0;
      while( true ) {
        iVar4 = local_3c;
        pVVar6 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&this_local);
        iVar5 = VariableType::getNumElements(pVVar6);
        bVar1 = local_35;
        if (iVar5 <= iVar4) break;
        local_50 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)&this_local,local_3c);
        a_00 = ConstStridedValueAccess<64>::asFloat(&local_50,elemNdx);
        _auStack_60 = ConstStridedValueAccess<64>::component(&b,local_3c);
        b_01 = ConstStridedValueAccess<64>::asFloat
                         ((ConstStridedValueAccess<64> *)auStack_60,elemNdx);
        bVar2 = anon_unknown_71::EqualityCompare<true>::compare<float>(a_00,b_01);
        local_35 = anon_unknown_71::EqualityCompare<true>::combine((bool)(bVar1 & 1),bVar2);
        local_3c = local_3c + 1;
      }
      pbVar7 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&a_local.m_value,elemNdx);
      *pbVar7 = (bool)(bVar1 & 1);
    }
  }
  else if (TVar3 == TYPE_INT) {
    for (elemNdx_1 = 0; elemNdx_1 < 0x40; elemNdx_1 = elemNdx_1 + 1) {
      local_65 = true;
      local_6c = 0;
      while( true ) {
        iVar4 = local_6c;
        pVVar6 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&this_local);
        iVar5 = VariableType::getNumElements(pVVar6);
        bVar1 = local_65;
        if (iVar5 <= iVar4) break;
        local_80 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)&this_local,local_6c);
        iVar4 = ConstStridedValueAccess<64>::asInt(&local_80,elemNdx_1);
        _auStack_90 = ConstStridedValueAccess<64>::component(&b,local_6c);
        iVar5 = ConstStridedValueAccess<64>::asInt
                          ((ConstStridedValueAccess<64> *)auStack_90,elemNdx_1);
        bVar2 = anon_unknown_71::EqualityCompare<true>::compare<int>(iVar4,iVar5);
        local_65 = anon_unknown_71::EqualityCompare<true>::combine((bool)(bVar1 & 1),bVar2);
        local_6c = local_6c + 1;
      }
      pbVar7 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&a_local.m_value,elemNdx_1);
      *pbVar7 = (bool)(bVar1 & 1);
    }
  }
  else if (TVar3 == TYPE_BOOL) {
    for (elemNdx_2 = 0; elemNdx_2 < 0x40; elemNdx_2 = elemNdx_2 + 1) {
      local_95 = true;
      local_9c = 0;
      while( true ) {
        iVar4 = local_9c;
        pVVar6 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&this_local);
        iVar5 = VariableType::getNumElements(pVVar6);
        bVar1 = local_95;
        if (iVar5 <= iVar4) break;
        local_b0 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)&this_local,local_9c);
        bVar2 = ConstStridedValueAccess<64>::asBool(&local_b0,elemNdx_2);
        local_c0 = ConstStridedValueAccess<64>::component(&b,local_9c);
        b_00 = ConstStridedValueAccess<64>::asBool(&local_c0,elemNdx_2);
        bVar2 = anon_unknown_71::EqualityCompare<true>::compare<bool>(bVar2,b_00);
        local_95 = anon_unknown_71::EqualityCompare<true>::combine((bool)(bVar1 & 1),bVar2);
        local_9c = local_9c + 1;
      }
      pbVar7 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)&a_local.m_value,elemNdx_2);
      *pbVar7 = (bool)(bVar1 & 1);
    }
  }
  return;
}

Assistant:

void EqualityComparisonOp<IsEqual>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());


	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asBool(compNdx), b.component(elemNdx).asBool(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}